

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

void remove_expired(CookieInfo *cookies)

{
  Cookie *pCVar1;
  long lVar2;
  time_t tVar3;
  Cookie *pCVar4;
  Cookie *pCVar5;
  Cookie *co;
  long lVar6;
  
  tVar3 = time((time_t *)0x0);
  if (cookies->next_expiration <= tVar3 || cookies->next_expiration == 0x7fffffffffffffff) {
    cookies->next_expiration = 0x7fffffffffffffff;
    lVar6 = 0;
    do {
      if (cookies->cookies[lVar6] != (Cookie *)0x0) {
        pCVar5 = (Cookie *)0x0;
        co = cookies->cookies[lVar6];
        do {
          pCVar1 = co->next;
          lVar2 = co->expires;
          if (lVar2 < tVar3 && lVar2 != 0) {
            pCVar4 = pCVar5;
            if (pCVar5 == (Cookie *)0x0) {
              pCVar4 = (Cookie *)(cookies->cookies + lVar6);
            }
            pCVar4->next = pCVar1;
            cookies->numcookies = cookies->numcookies + -1;
            freecookie(co);
            co = pCVar5;
          }
          else if ((lVar2 != 0) && (lVar2 < cookies->next_expiration)) {
            cookies->next_expiration = lVar2;
          }
          pCVar5 = co;
          co = pCVar1;
        } while (pCVar1 != (Cookie *)0x0);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x100);
  }
  return;
}

Assistant:

static void remove_expired(struct CookieInfo *cookies)
{
  struct Cookie *co, *nx;
  curl_off_t now = (curl_off_t)time(NULL);
  unsigned int i;

  /*
   * If the earliest expiration timestamp in the jar is in the future we can
   * skip scanning the whole jar and instead exit early as there won't be any
   * cookies to evict.  If we need to evict however, reset the next_expiration
   * counter in order to track the next one. In case the recorded first
   * expiration is the max offset, then perform the safe fallback of checking
   * all cookies.
   */
  if(now < cookies->next_expiration &&
      cookies->next_expiration != CURL_OFF_T_MAX)
    return;
  else
    cookies->next_expiration = CURL_OFF_T_MAX;

  for(i = 0; i < COOKIE_HASH_SIZE; i++) {
    struct Cookie *pv = NULL;
    co = cookies->cookies[i];
    while(co) {
      nx = co->next;
      if(co->expires && co->expires < now) {
        if(!pv) {
          cookies->cookies[i] = co->next;
        }
        else {
          pv->next = co->next;
        }
        cookies->numcookies--;
        freecookie(co);
      }
      else {
        /*
         * If this cookie has an expiration timestamp earlier than what we've
         * seen so far then record it for the next round of expirations.
         */
        if(co->expires && co->expires < cookies->next_expiration)
          cookies->next_expiration = co->expires;
        pv = co;
      }
      co = nx;
    }
  }
}